

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scala_kbm.cpp
# Opt level: O3

kbm * scala::read_kbm(kbm *__return_storage_ptr__,ifstream *input_file)

{
  int iVar1;
  iterator iVar2;
  double dVar3;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var4;
  char cVar5;
  bool bVar6;
  int *piVar7;
  long lVar8;
  runtime_error *this;
  undefined8 uVar9;
  undefined4 uVar10;
  ulong uVar11;
  string buffer;
  regex EX;
  regex COMMENT_REGEX;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_d8;
  long local_d0;
  undefined1 local_c8 [16];
  match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_b8;
  vector<int,std::allocator<int>> *local_98;
  basic_regex<char,_std::__cxx11::regex_traits<char>_> local_90;
  basic_regex<char,_std::__cxx11::regex_traits<char>_> local_70;
  basic_regex<char,_std::__cxx11::regex_traits<char>_> local_50;
  
  local_d8._M_current = local_c8;
  local_d0 = 0;
  local_c8[0] = '\0';
  (__return_storage_ptr__->mapping).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->mapping).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->mapping).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  __return_storage_ptr__->last_note = 0;
  __return_storage_ptr__->middle_note = 0;
  __return_storage_ptr__->reference_note = 0;
  __return_storage_ptr__->octave_degree = 0;
  __return_storage_ptr__->reference_frequency = 0.0;
  __return_storage_ptr__->map_size = 0;
  __return_storage_ptr__->first_note = 0;
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
            (&local_70,"[ \t]*!.*",0x10);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
            (&local_90,"^[ \t]*[xX]{1}.*",0x10);
  lVar8 = *(long *)(*(long *)input_file + -0x18);
  if (((byte)input_file[lVar8 + 0x20] & 5) == 0) {
    local_98 = (vector<int,std::allocator<int>> *)&__return_storage_ptr__->mapping;
    uVar10 = 0;
    do {
      cVar5 = std::ios::widen((char)lVar8 + (char)input_file);
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                ((istream *)input_file,(string *)&local_d8,cVar5);
      local_b8.
      super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      .
      super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_b8._M_begin._M_current = (char *)0x0;
      local_b8.
      super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      .
      super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_b8.
      super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      .
      super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      bVar6 = std::__detail::
              __regex_algo_impl<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>,(std::__detail::_RegexExecutorPolicy)0,true>
                        (local_d8,(__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                   )(local_d8._M_current + local_d0),&local_b8,&local_70,0);
      if (local_b8.
          super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          .
          super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_b8.
                        super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                        .
                        super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start);
      }
      if (bVar6) goto switchD_00111aed_default;
      std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
                (&local_50,"[ \t]*",0x10);
      local_b8.
      super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      .
      super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_b8._M_begin._M_current = (char *)0x0;
      local_b8.
      super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      .
      super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_b8.
      super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      .
      super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      bVar6 = std::__detail::
              __regex_algo_impl<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>,(std::__detail::_RegexExecutorPolicy)0,true>
                        (local_d8,(__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                   )(local_d8._M_current + local_d0),&local_b8,&local_50,0);
      if (local_b8.
          super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          .
          super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_b8.
                        super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                        .
                        super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start);
      }
      std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex(&local_50);
      _Var4._M_current = local_d8._M_current;
      if (bVar6) goto switchD_00111aed_default;
      switch(uVar10) {
      case 0:
        piVar7 = __errno_location();
        iVar1 = *piVar7;
        *piVar7 = 0;
        lVar8 = strtol(_Var4._M_current,(char **)&local_b8,10);
        if (local_b8.
            super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            .
            super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)_Var4._M_current) {
          if ((0xfffffffeffffffff < lVar8 - 0x80000000U) && (*piVar7 != 0x22)) {
            if (*piVar7 == 0) {
              *piVar7 = iVar1;
            }
            __return_storage_ptr__->map_size = (int)lVar8;
            uVar10 = 1;
            break;
          }
          goto LAB_00111ff7;
        }
        goto LAB_00112003;
      case 1:
        piVar7 = __errno_location();
        iVar1 = *piVar7;
        *piVar7 = 0;
        lVar8 = strtol(_Var4._M_current,(char **)&local_b8,10);
        if (local_b8.
            super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            .
            super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)_Var4._M_current) {
          if ((0xfffffffeffffffff < lVar8 - 0x80000000U) && (*piVar7 != 0x22)) {
            if (*piVar7 == 0) {
              *piVar7 = iVar1;
            }
            __return_storage_ptr__->first_note = (int)lVar8;
            uVar10 = 2;
            break;
          }
          goto LAB_00111fdf;
        }
        goto LAB_00111feb;
      case 2:
        piVar7 = __errno_location();
        iVar1 = *piVar7;
        *piVar7 = 0;
        lVar8 = strtol(_Var4._M_current,(char **)&local_b8,10);
        if (local_b8.
            super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            .
            super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)_Var4._M_current) {
          if ((0xfffffffeffffffff < lVar8 - 0x80000000U) && (*piVar7 != 0x22)) {
            if (*piVar7 == 0) {
              *piVar7 = iVar1;
            }
            __return_storage_ptr__->last_note = (int)lVar8;
            uVar10 = 3;
            break;
          }
          goto LAB_00111fc7;
        }
        goto LAB_00111fd3;
      case 3:
        piVar7 = __errno_location();
        iVar1 = *piVar7;
        *piVar7 = 0;
        lVar8 = strtol(_Var4._M_current,(char **)&local_b8,10);
        if (local_b8.
            super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            .
            super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)_Var4._M_current) {
          if ((0xfffffffeffffffff < lVar8 - 0x80000000U) && (*piVar7 != 0x22)) {
            if (*piVar7 == 0) {
              *piVar7 = iVar1;
            }
            __return_storage_ptr__->middle_note = (int)lVar8;
            uVar10 = 4;
            break;
          }
          goto LAB_00111faf;
        }
        goto LAB_00111fbb;
      case 4:
        piVar7 = __errno_location();
        iVar1 = *piVar7;
        *piVar7 = 0;
        lVar8 = strtol(_Var4._M_current,(char **)&local_b8,10);
        if (local_b8.
            super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            .
            super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)_Var4._M_current) {
          if ((0xfffffffeffffffff < lVar8 - 0x80000000U) && (*piVar7 != 0x22)) {
            if (*piVar7 == 0) {
              *piVar7 = iVar1;
            }
            __return_storage_ptr__->reference_note = (int)lVar8;
            uVar10 = 5;
            break;
          }
          goto LAB_00111f97;
        }
        goto LAB_00111fa3;
      case 5:
        piVar7 = __errno_location();
        iVar1 = *piVar7;
        *piVar7 = 0;
        dVar3 = strtod(_Var4._M_current,(char **)&local_b8);
        if (local_b8.
            super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            .
            super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start == (pointer)_Var4._M_current)
        goto LAB_00111f8b;
        if (*piVar7 == 0) {
          *piVar7 = iVar1;
        }
        else if (*piVar7 == 0x22) goto LAB_00112027;
        __return_storage_ptr__->reference_frequency = dVar3;
        uVar10 = 6;
        break;
      case 6:
        piVar7 = __errno_location();
        iVar1 = *piVar7;
        *piVar7 = 0;
        lVar8 = strtol(_Var4._M_current,(char **)&local_b8,10);
        if (local_b8.
            super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            .
            super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)_Var4._M_current) {
          if ((0xfffffffeffffffff < lVar8 - 0x80000000U) && (*piVar7 != 0x22)) {
            if (*piVar7 == 0) {
              *piVar7 = iVar1;
            }
            __return_storage_ptr__->octave_degree = (int)lVar8;
            uVar10 = 7;
            break;
          }
          std::__throw_out_of_range("stoi");
        }
        std::__throw_invalid_argument("stoi");
LAB_00111f8b:
        std::__throw_invalid_argument("stod");
LAB_00111f97:
        std::__throw_out_of_range("stoi");
LAB_00111fa3:
        std::__throw_invalid_argument("stoi");
LAB_00111faf:
        std::__throw_out_of_range("stoi");
LAB_00111fbb:
        std::__throw_invalid_argument("stoi");
LAB_00111fc7:
        std::__throw_out_of_range("stoi");
LAB_00111fd3:
        std::__throw_invalid_argument("stoi");
LAB_00111fdf:
        std::__throw_out_of_range("stoi");
LAB_00111feb:
        std::__throw_invalid_argument("stoi");
LAB_00111ff7:
        std::__throw_out_of_range("stoi");
LAB_00112003:
        std::__throw_invalid_argument("stoi");
LAB_0011200f:
        std::__throw_out_of_range("stoi");
LAB_0011201b:
        std::__throw_invalid_argument("stoi");
LAB_00112027:
        uVar9 = std::__throw_out_of_range("stod");
        __cxa_free_exception(&local_50);
        std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex(&local_90);
        std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex(&local_70);
        kbm::~kbm(__return_storage_ptr__);
        if ((pointer)local_d8._M_current != (pointer)local_c8) {
          operator_delete(local_d8._M_current);
        }
        _Unwind_Resume(uVar9);
      case 7:
        local_b8.
        super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        .
        super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_b8._M_begin._M_current = (char *)0x0;
        local_b8.
        super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        .
        super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_b8.
        super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        .
        super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        bVar6 = std::__detail::
                __regex_algo_impl<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>,(std::__detail::_RegexExecutorPolicy)0,true>
                          (local_d8,(__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                     )(local_d8._M_current + local_d0),&local_b8,&local_90,0);
        if (local_b8.
            super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            .
            super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_b8.
                          super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                          .
                          super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
        }
        _Var4._M_current = local_d8._M_current;
        if (bVar6) {
          local_b8.
          super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          .
          super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start =
               (pointer)CONCAT44(local_b8.
                                 super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                 .
                                 super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start._4_4_,0xffffffff);
          iVar2._M_current =
               (__return_storage_ptr__->mapping).super__Vector_base<int,_std::allocator<int>_>.
               _M_impl.super__Vector_impl_data._M_finish;
          if (iVar2._M_current ==
              (__return_storage_ptr__->mapping).super__Vector_base<int,_std::allocator<int>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                      (local_98,iVar2,(int *)&local_b8);
          }
          else {
            *iVar2._M_current = -1;
            (__return_storage_ptr__->mapping).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish = iVar2._M_current + 1;
          }
LAB_00111f24:
          uVar10 = 7;
          break;
        }
        piVar7 = __errno_location();
        iVar1 = *piVar7;
        *piVar7 = 0;
        lVar8 = strtol(_Var4._M_current,(char **)&local_b8,10);
        if (local_b8.
            super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            .
            super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)_Var4._M_current) {
          if ((0xfffffffeffffffff < lVar8 - 0x80000000U) && (*piVar7 != 0x22)) {
            if (*piVar7 == 0) {
              *piVar7 = iVar1;
            }
            local_b8.
            super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            .
            super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start =
                 (pointer)CONCAT44(local_b8.
                                   super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                   .
                                   super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start._4_4_,(int)lVar8);
            iVar2._M_current =
                 (__return_storage_ptr__->mapping).super__Vector_base<int,_std::allocator<int>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
            if (iVar2._M_current ==
                (__return_storage_ptr__->mapping).super__Vector_base<int,_std::allocator<int>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                        (local_98,iVar2,(int *)&local_b8);
            }
            else {
              *iVar2._M_current = (int)lVar8;
              (__return_storage_ptr__->mapping).super__Vector_base<int,_std::allocator<int>_>.
              _M_impl.super__Vector_impl_data._M_finish = iVar2._M_current + 1;
            }
            goto LAB_00111f24;
          }
          goto LAB_0011200f;
        }
        goto LAB_0011201b;
      }
switchD_00111aed_default:
      lVar8 = *(long *)(*(long *)input_file + -0x18);
    } while (((byte)input_file[lVar8 + 0x20] & 5) == 0);
  }
  iVar1 = __return_storage_ptr__->map_size;
  uVar11 = (long)(__return_storage_ptr__->mapping).super__Vector_base<int,_std::allocator<int>_>.
                 _M_impl.super__Vector_impl_data._M_finish -
           (long)(__return_storage_ptr__->mapping).super__Vector_base<int,_std::allocator<int>_>.
                 _M_impl.super__Vector_impl_data._M_start >> 2;
  if (uVar11 != (long)iVar1) {
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    if ((ulong)(long)iVar1 < uVar11) {
      std::runtime_error::runtime_error(this,"ERROR: Too few entires in mapping file");
    }
    else {
      std::runtime_error::runtime_error(this,"ERROR: Too many entires in mapping file");
    }
    __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex(&local_90);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex(&local_70);
  if ((pointer)local_d8._M_current != (pointer)local_c8) {
    operator_delete(local_d8._M_current);
  }
  return __return_storage_ptr__;
}

Assistant:

kbm read_kbm(std::ifstream& input_file){
        std::string buffer;
        unsigned int current_entry = 0;
        kbm keyboard_mapping;

#ifdef SCALA_STRICT
        std::regex COMMENT_REGEX = std::regex("^!.*");
        std::regex EX = std::regex("^[ \t]*[x]{1}.*");
#else
        std::regex COMMENT_REGEX = std::regex("[ \t]*!.*");
        std::regex EX = std::regex("^[ \t]*[xX]{1}.*");
#endif
    
        while(input_file){
            getline(input_file, buffer);
            if (std::regex_match (buffer, COMMENT_REGEX)) {
                // Ignore comments
            } else if (std::regex_match (buffer, std::regex("[ \t]*") )) {
                // Blank line. If we're in strict mode this means end of file.
                // Stop parsing.
#ifdef SCALA_STRICT
                break;
#endif
            } else {
                switch(current_entry){
                    case MAP_SIZE: 
                        keyboard_mapping.map_size = std::stoi(buffer);
                        current_entry += 1;
                        break;
                    case FIRST_NOTE: 
                        keyboard_mapping.first_note = std::stoi(buffer);
                        current_entry += 1;
                        break;
                    case LAST_NOTE: 
                        keyboard_mapping.last_note = std::stoi(buffer);
                        current_entry += 1;
                        break;
                    case MIDDLE_NOTE: 
                        keyboard_mapping.middle_note = std::stoi(buffer);
                        current_entry += 1;
                        break;
                    case REFERENCE_NOTE: 
                        keyboard_mapping.reference_note = std::stoi(buffer);
                        current_entry += 1;
                        break;
                    case REFERENCE_FREQUENCY: 
                        keyboard_mapping.reference_frequency = std::stod(buffer);
                        current_entry += 1;
                        break;
                    case OCTAVE_DEGREE: 
                        keyboard_mapping.octave_degree = std::stoi(buffer);
                        current_entry += 1;
                        break;
                    case ACTUAL_MAP:
                        // This one is a little more complicated.  If we have an x
                        if (std::regex_match (buffer, EX)) {
                            // A non-entry
                            keyboard_mapping.add_mapping(KBM_NON_ENTRY);
                        } else {
                            // A mapping entry
                            keyboard_mapping.add_mapping(std::stoi(buffer));
                        }
                }
            }
        }
        if (static_cast <size_t> (keyboard_mapping.map_size) != keyboard_mapping.mapping.size()){
            // This is an error, strict mode or not 
            if (static_cast <size_t> (keyboard_mapping.map_size) < keyboard_mapping.mapping.size()){
                throw std::runtime_error("ERROR: Too few entires in mapping file");
            } else {
                throw std::runtime_error("ERROR: Too many entires in mapping file");
            }
        }
        return keyboard_mapping;
    }